

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

void Ssw_RarManSimulate(Ssw_RarMan_t *p,Vec_Int_t *vInit,int fUpdate,int fFirst)

{
  uint uVar1;
  Aig_Obj_t **ppAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  undefined8 uVar5;
  Vec_Ptr_t *p_00;
  int iVar6;
  Aig_Obj_t *pAVar7;
  word *pwVar8;
  word *pwVar9;
  word *pwVar10;
  Aig_Man_t *pAVar11;
  void *pvVar12;
  Vec_Ptr_t *pVVar13;
  int Id;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  
  Ssw_RarManInitialize(p,vInit);
  p->vUpdConst->nSize = 0;
  p->vUpdClass->nSize = 0;
  Aig_ManIncrementTravId(p->pAig);
  if (fUpdate != 0) {
    for (iVar16 = 0; pVVar13 = p->pAig->vCis, iVar16 < pVVar13->nSize; iVar16 = iVar16 + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pVVar13,iVar16);
      ppAVar2 = p->pAig->pReprs;
      if (((ppAVar2 != (Aig_Obj_t **)0x0) &&
          (pAVar3 = ppAVar2[pAVar7->Id], pAVar3 != (Aig_Obj_t *)0x0)) &&
         (pAVar3->TravId != p->pAig->nTravIds)) {
        iVar6 = Ssw_RarManObjsAreEqual(p,pAVar7,pAVar3);
        if (iVar6 == 0) {
          if (pAVar3 == p->pAig->pConst1) {
            Vec_PtrPush(p->vUpdConst,pAVar7);
          }
          else {
            Vec_PtrPush(p->vUpdClass,pAVar3);
            pAVar3->TravId = p->pAig->nTravIds;
          }
        }
      }
    }
  }
  iVar16 = 0;
  while( true ) {
    pAVar11 = p->pAig;
    if (pAVar11->vObjs->nSize <= iVar16) break;
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pAVar11->vObjs,iVar16);
    if ((pAVar7 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar7->field_0x18 & 7) - 7)) {
      pwVar8 = Ssw_RarObjSim(p,pAVar7->Id);
      Id = -1;
      iVar6 = Id;
      if (pAVar7->pFanin0 != (Aig_Obj_t *)0x0) {
        iVar6 = *(int *)(((ulong)pAVar7->pFanin0 & 0xfffffffffffffffe) + 0x24);
      }
      pwVar9 = Ssw_RarObjSim(p,iVar6);
      if (pAVar7->pFanin1 != (Aig_Obj_t *)0x0) {
        Id = *(int *)(((ulong)pAVar7->pFanin1 & 0xfffffffffffffffe) + 0x24);
      }
      pwVar10 = Ssw_RarObjSim(p,Id);
      pAVar3 = pAVar7->pFanin0;
      pAVar4 = pAVar7->pFanin1;
      uVar1 = p->pPars->nWords;
      uVar14 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar14 = 0;
      }
      for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
        pwVar8[uVar15] =
             (pwVar10[uVar15] ^ -(ulong)((uint)pAVar4 & 1)) &
             (pwVar9[uVar15] ^ -(ulong)((uint)pAVar3 & 1));
      }
      if (fUpdate != 0) {
        ppAVar2 = p->pAig->pReprs;
        if (((ppAVar2 != (Aig_Obj_t **)0x0) &&
            (pAVar3 = ppAVar2[pAVar7->Id], pAVar3 != (Aig_Obj_t *)0x0)) &&
           (pAVar3->TravId != p->pAig->nTravIds)) {
          iVar6 = Ssw_RarManObjsAreEqual(p,pAVar7,pAVar3);
          if (iVar6 == 0) {
            if (pAVar3 == p->pAig->pConst1) {
              Vec_PtrPush(p->vUpdConst,pAVar7);
            }
            else {
              Vec_PtrPush(p->vUpdClass,pAVar3);
              pAVar3->TravId = p->pAig->nTravIds;
            }
          }
        }
      }
    }
    iVar16 = iVar16 + 1;
  }
  for (iVar16 = 0; iVar16 < pAVar11->vCos->nSize; iVar16 = iVar16 + 1) {
    pvVar12 = Vec_PtrEntry(pAVar11->vCos,iVar16);
    pwVar8 = Ssw_RarObjSim(p,*(int *)((long)pvVar12 + 0x24));
    iVar6 = -1;
    if (*(ulong *)((long)pvVar12 + 8) != 0) {
      iVar6 = *(int *)((*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffe) + 0x24);
    }
    pwVar9 = Ssw_RarObjSim(p,iVar6);
    uVar5 = *(undefined8 *)((long)pvVar12 + 8);
    uVar1 = p->pPars->nWords;
    uVar14 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar14 = 0;
    }
    for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
      pwVar8[uVar15] = pwVar9[uVar15] ^ -(ulong)((uint)uVar5 & 1);
    }
    pAVar11 = p->pAig;
  }
  if (fUpdate == 0) {
    return;
  }
  if (fFirst == 0) {
    Ssw_ClassesRefineConst1Group(p->ppClasses,p->vUpdConst,1);
    Ssw_ClassesRefineGroup(p->ppClasses,p->vUpdClass,1);
    return;
  }
  pVVar13 = Vec_PtrAlloc(1000);
  for (iVar16 = 0; p_00 = p->pAig->vObjs, iVar16 < p_00->nSize; iVar16 = iVar16 + 1) {
    pvVar12 = Vec_PtrEntry(p_00,iVar16);
    if (pvVar12 != (void *)0x0) {
      ppAVar2 = p->pAig->pReprs;
      if (ppAVar2 == (Aig_Obj_t **)0x0) {
        pAVar7 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar7 = ppAVar2[*(int *)((long)pvVar12 + 0x24)];
      }
      if (pAVar7 == p->pAig->pConst1) {
        Vec_PtrPush(pVVar13,pvVar12);
      }
    }
  }
  iVar16 = pVVar13->nSize;
  iVar6 = Ssw_ClassesCand1Num(p->ppClasses);
  if (iVar16 == iVar6) {
    Ssw_ClassesPrepareRehash(p->ppClasses,pVVar13,0);
    free(pVVar13->pArray);
    free(pVVar13);
    return;
  }
  __assert_fail("Vec_PtrSize(vCands) == Ssw_ClassesCand1Num(p->ppClasses)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                ,0x2d7,"void Ssw_RarManSimulate(Ssw_RarMan_t *, Vec_Int_t *, int, int)");
}

Assistant:

void Ssw_RarManSimulate( Ssw_RarMan_t * p, Vec_Int_t * vInit, int fUpdate, int fFirst )
{
    Aig_Obj_t * pObj, * pRepr;
    word * pSim, * pSim0, * pSim1;
    word Flip, Flip0, Flip1;
    int w, i;
    // initialize
    Ssw_RarManInitialize( p, vInit );
    Vec_PtrClear( p->vUpdConst );
    Vec_PtrClear( p->vUpdClass );
    Aig_ManIncrementTravId( p->pAig );
    // check comb inputs
    if ( fUpdate )
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        pRepr = Aig_ObjRepr(p->pAig, pObj);
        if ( pRepr == NULL || Aig_ObjIsTravIdCurrent( p->pAig, pRepr ) )
            continue;
        if ( Ssw_RarManObjsAreEqual( p, pObj, pRepr ) )
            continue;
        // save for update
        if ( pRepr == Aig_ManConst1(p->pAig) )
            Vec_PtrPush( p->vUpdConst, pObj );
        else
        {
            Vec_PtrPush( p->vUpdClass, pRepr );
            Aig_ObjSetTravIdCurrent( p->pAig, pRepr );
        }
    }
    // simulate
    Aig_ManForEachNode( p->pAig, pObj, i )
    {
        pSim  = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
        pSim0 = Ssw_RarObjSim( p, Aig_ObjFaninId0(pObj) );
        pSim1 = Ssw_RarObjSim( p, Aig_ObjFaninId1(pObj) );
        Flip0 = Aig_ObjFaninC0(pObj) ? ~(word)0 : 0;
        Flip1 = Aig_ObjFaninC1(pObj) ? ~(word)0 : 0;
        for ( w = 0; w < p->pPars->nWords; w++ )
            pSim[w] = (Flip0 ^ pSim0[w]) & (Flip1 ^ pSim1[w]);


        if ( !fUpdate )
            continue;
        // check classes
        pRepr = Aig_ObjRepr(p->pAig, pObj);
        if ( pRepr == NULL || Aig_ObjIsTravIdCurrent( p->pAig, pRepr ) )
            continue;
        if ( Ssw_RarManObjsAreEqual( p, pObj, pRepr ) )
            continue;
        // save for update
        if ( pRepr == Aig_ManConst1(p->pAig) )
            Vec_PtrPush( p->vUpdConst, pObj );
        else
        {
            Vec_PtrPush( p->vUpdClass, pRepr );
            Aig_ObjSetTravIdCurrent( p->pAig, pRepr );
        }
    }
    // transfer to POs
    Aig_ManForEachCo( p->pAig, pObj, i )
    {
        pSim  = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
        pSim0 = Ssw_RarObjSim( p, Aig_ObjFaninId0(pObj) );
        Flip  = Aig_ObjFaninC0(pObj) ? ~(word)0 : 0;
        for ( w = 0; w < p->pPars->nWords; w++ )
            pSim[w] = Flip ^ pSim0[w];
    }
    // refine classes
    if ( fUpdate )
    {
        if ( fFirst )
        {
            Vec_Ptr_t * vCands = Vec_PtrAlloc( 1000 );
            Aig_ManForEachObj( p->pAig, pObj, i )
                if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
                    Vec_PtrPush( vCands, pObj );
            assert( Vec_PtrSize(vCands) == Ssw_ClassesCand1Num(p->ppClasses) );
            Ssw_ClassesPrepareRehash( p->ppClasses, vCands, 0 );
            Vec_PtrFree( vCands );
        }
        else
        {
            Ssw_ClassesRefineConst1Group( p->ppClasses, p->vUpdConst, 1 );
            Ssw_ClassesRefineGroup( p->ppClasses, p->vUpdClass, 1 );
        }
    }
}